

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<float>::SolveBICGStab
          (TPZMatrix<float> *this,int64_t *numiterations,TPZSolver *preconditioner,
          TPZFMatrix<float> *F,TPZFMatrix<float> *result,TPZFMatrix<float> *residual,REAL *tol,
          int FromCurrent)

{
  TPZMatrixSolver<float> *M;
  
  M = (TPZMatrixSolver<float> *)
      __dynamic_cast(preconditioner,&TPZSolver::typeinfo,&TPZMatrixSolver<float>::typeinfo,0);
  if (M != (TPZMatrixSolver<float> *)0x0) {
    BiCGSTAB<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (this,result,F,M,numiterations,tol,residual,FromCurrent);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void TPZMatrix<TVar>::SolveBICGStab(int64_t &numiterations, TPZSolver &preconditioner,
							  const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
							  TPZFMatrix<TVar> *residual, REAL &tol,const int FromCurrent)  {
    if constexpr(std::is_floating_point<TVar>::value){
        TPZMatrixSolver<TVar> &precond = dynamic_cast<TPZMatrixSolver<TVar> &>(preconditioner);
        BiCGSTAB(*this,result,F,precond,numiterations,tol,residual,FromCurrent);
    }else{
        PZError<<__PRETTY_FUNCTION__<<" is currently not implemented ";
        PZError<<"for this type\nAborting...";
        DebugStop();
    }    
}